

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O2

int main(void)

{
  MatchTool *pMVar1;
  MatchTable mt;
  string id;
  string integer;
  string digit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string number;
  string letter;
  string ws;
  
  std::__cxx11::string::string((string *)&ws,"( |\t|\n|\r)+",(allocator *)&mt);
  std::__cxx11::string::string
            ((string *)&letter,
             "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)"
             ,(allocator *)&mt);
  std::__cxx11::string::string((string *)&digit,"(1|2|3|4|5|6|7|8|9|0)",(allocator *)&mt);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,"(+|-)?",
                 &digit);
  std::operator+(&integer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,
                 "+");
  std::__cxx11::string::~string((string *)&mt);
  std::operator+(&local_c8,&integer,"(\\.");
  std::operator+(&local_a8,&local_c8,&digit);
  std::operator+(&local_88,&local_a8,"+)?");
  std::operator+(&id,&local_88,"((e|E)");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,&id,
                 &integer);
  std::operator+(&number,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,
                 "+)?");
  std::__cxx11::string::~string((string *)&mt);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,"(_|",
                 &letter);
  std::operator+(&id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mt,")+");
  std::__cxx11::string::~string((string *)&mt);
  mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  mt.regs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  mt.regs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mt.regs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MatchTable::add(&mt,ws._M_dataplus._M_p);
  MatchTable::add(&mt,id._M_dataplus._M_p);
  MatchTable::add(&mt,number._M_dataplus._M_p);
  MatchTable::generate(&mt);
  pMVar1 = MatchTable::getTool(&mt,0);
  print_tool(pMVar1,(ostream *)&std::cout);
  pMVar1 = MatchTable::getTool(&mt,1);
  print_tool(pMVar1,(ostream *)&std::cout);
  pMVar1 = MatchTable::getTool(&mt,2);
  print_tool(pMVar1,(ostream *)&std::cout);
  MatchTable::~MatchTable(&mt);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&number);
  std::__cxx11::string::~string((string *)&integer);
  std::__cxx11::string::~string((string *)&digit);
  std::__cxx11::string::~string((string *)&letter);
  std::__cxx11::string::~string((string *)&ws);
  return 0;
}

Assistant:

int main() {
    string ws = "( |\t|\n|\r)+";
    string letter = "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z"
                    "|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)";
    string digit = "(1|2|3|4|5|6|7|8|9|0)";
    string integer = "(+|-)?" + digit + "+";
    string number = integer + "(\\." + digit + "+)?" + "((e|E)" + integer + "+)?";
    string id = "(_|" + letter + ")+";

    MatchTable mt;
    mt.add(ws.c_str());
    mt.add(id.c_str());
    mt.add(number.c_str());
    mt.generate();

    print_tool(mt.getTool(0), cout);
    print_tool(mt.getTool(1), cout);
    print_tool(mt.getTool(2), cout);

}